

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateExtensionRegistrationCode
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  int iVar1;
  ImmutableMessageLiteGenerator *in_RSI;
  long in_RDI;
  int i_1;
  int i;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  Printer *in_stack_ffffffffffffff78;
  ImmutableExtensionLiteGenerator *in_stack_ffffffffffffff80;
  undefined4 local_60;
  Context *in_stack_ffffffffffffffc0;
  Descriptor *in_stack_ffffffffffffffc8;
  Context *in_stack_ffffffffffffffd0;
  FieldDescriptor *in_stack_ffffffffffffffd8;
  ImmutableExtensionLiteGenerator *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar2;
  int index;
  
  iVar2 = 0;
  while( true ) {
    index = iVar2;
    iVar1 = Descriptor::extension_count(*(Descriptor **)(in_RDI + 8));
    if (iVar1 <= iVar2) break;
    Descriptor::extension(*(Descriptor **)(in_RDI + 8),index);
    ImmutableExtensionLiteGenerator::ImmutableExtensionLiteGenerator
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    ImmutableExtensionLiteGenerator::GenerateRegistrationCode
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    ImmutableExtensionLiteGenerator::~ImmutableExtensionLiteGenerator
              ((ImmutableExtensionLiteGenerator *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    iVar2 = index + 1;
  }
  local_60 = 0;
  while( true ) {
    iVar2 = local_60;
    iVar1 = Descriptor::nested_type_count(*(Descriptor **)(in_RDI + 8));
    if (iVar1 <= iVar2) break;
    Descriptor::nested_type(*(Descriptor **)(in_RDI + 8),local_60);
    ImmutableMessageLiteGenerator
              ((ImmutableMessageLiteGenerator *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
               in_stack_ffffffffffffffc0);
    GenerateExtensionRegistrationCode(in_RSI,(Printer *)CONCAT44(index,in_stack_ffffffffffffffe8));
    ~ImmutableMessageLiteGenerator
              ((ImmutableMessageLiteGenerator *)CONCAT44(iVar2,in_stack_ffffffffffffff40));
    local_60 = local_60 + 1;
  }
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateExtensionRegistrationCode(
    io::Printer* printer) {
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ImmutableExtensionLiteGenerator(descriptor_->extension(i), context_)
        .GenerateRegistrationCode(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    ImmutableMessageLiteGenerator(descriptor_->nested_type(i), context_)
        .GenerateExtensionRegistrationCode(printer);
  }
}